

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall crnlib::dxt_hc::dxt_hc(dxt_hc *this)

{
  crn_thread_id_t cVar1;
  
  (this->m_tiles).m_p = (tile_details *)0x0;
  (this->m_tiles).m_size = 0;
  (this->m_tiles).m_capacity = 0;
  this->m_num_blocks = 0;
  memset(&this->m_block_weights,0,0xc0);
  params::params(&this->m_params);
  *(undefined4 *)((long)&this->m_num_alpha_blocks + 3) = 0;
  this->m_num_alpha_blocks = 0;
  (this->m_color_clusters).m_p = (color_cluster *)0x0;
  (this->m_color_clusters).m_size = 0;
  (this->m_color_clusters).m_capacity = 0;
  (this->m_alpha_clusters).m_p = (alpha_cluster *)0x0;
  (this->m_alpha_clusters).m_size = 0;
  (this->m_alpha_clusters).m_capacity = 0;
  cVar1 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar1;
  this->m_canceled = false;
  this->m_pTask_pool = (task_pool *)0x0;
  this->m_prev_phase_index = -1;
  this->m_prev_percentage_complete = -1;
  return;
}

Assistant:

dxt_hc::dxt_hc() :
        m_num_blocks(0),
        m_has_color_blocks(false),
        m_has_etc_color_blocks(false),
        m_has_subblocks(false),
        m_num_alpha_blocks(0),
        m_main_thread_id(crn_get_current_thread_id()),
        m_canceled(false),
        m_pTask_pool(nullptr),
        m_prev_phase_index(-1),
        m_prev_percentage_complete(-1)
    {
    }